

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

StackScriptFunction * __thiscall
Js::InterpreterStackFrame::GetStackNestedFunction(InterpreterStackFrame *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackScriptFunction *pSVar4;
  long lVar5;
  
  lVar5 = *(long *)(this + 0x88);
  if ((*(uint **)(lVar5 + 0xa8) == (uint *)0x0) || (**(uint **)(lVar5 + 0xa8) <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1e97,"(index < this->m_functionBody->GetNestedCount())",
                                "index < this->m_functionBody->GetNestedCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    lVar5 = *(long *)(this + 0x88);
  }
  pSVar4 = (StackScriptFunction *)0x0;
  if ((*(byte *)(lVar5 + 0x48) & 1) != 0) {
    pSVar4 = (StackScriptFunction *)((ulong)index * 0x50 + *(long *)(this + 0x48));
  }
  return pSVar4;
}

Assistant:

StackScriptFunction * InterpreterStackFrame::GetStackNestedFunction(uint index)
    {
        Assert(index < this->m_functionBody->GetNestedCount());
        // Re-check if we have disable stack nested function
        if (this->m_functionBody->DoStackNestedFunc())
        {
            return this->stackNestedFunctions + index;
        }
        return nullptr;
    }